

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.h
# Opt level: O1

ImageSpec * __thiscall
ImageInput::spec_dimensions
          (ImageSpec *__return_storage_ptr__,ImageInput *this,uint32_t param_1,uint32_t param_2)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  undefined4 *puVar6;
  
  iVar5 = (*this->_vptr_ImageInput[0xe])
                    (this,this,CONCAT44(in_register_00000014,param_1),
                     CONCAT44(in_register_0000000c,param_2));
  puVar6 = (undefined4 *)CONCAT44(extraout_var,iVar5);
  uVar2 = puVar6[1];
  uVar3 = puVar6[2];
  uVar4 = puVar6[3];
  *(undefined4 *)&(__return_storage_ptr__->formatDesc).basic = *puVar6;
  *(undefined4 *)&(__return_storage_ptr__->formatDesc).basic.field_0x4 = uVar2;
  *(undefined4 *)&(__return_storage_ptr__->formatDesc).basic.field_0x8 = uVar3;
  *(undefined4 *)&(__return_storage_ptr__->formatDesc).basic.field_0xc = uVar4;
  uVar1 = *(undefined8 *)(puVar6 + 4);
  (__return_storage_ptr__->formatDesc).extended.channelCount = (int)uVar1;
  (__return_storage_ptr__->formatDesc).extended.sameUnitAllChannels =
       (bool)(char)((ulong)uVar1 >> 0x20);
  *(int3 *)&(__return_storage_ptr__->formatDesc).extended.field_0x5 = (int3)((ulong)uVar1 >> 0x28);
  (__return_storage_ptr__->formatDesc).extended.oeGamma = (float)puVar6[6];
  (__return_storage_ptr__->formatDesc).extended.iccProfile.name._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->formatDesc).extended.iccProfile.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->formatDesc).extended.iccProfile,
             *(long *)(puVar6 + 8),*(long *)(puVar6 + 10) + *(long *)(puVar6 + 8));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(__return_storage_ptr__->formatDesc).extended.iccProfile.profile,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar6 + 0x10));
  std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::vector
            (&(__return_storage_ptr__->formatDesc).samples,
             (vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *)
             (puVar6 + 0x16));
  uVar1 = *(undefined8 *)(puVar6 + 0x1c);
  *(undefined8 *)((long)&__return_storage_ptr__->imageHeight + 3) =
       *(undefined8 *)((long)puVar6 + 0x77);
  __return_storage_ptr__->imageWidth = (int)uVar1;
  __return_storage_ptr__->imageHeight = (int)((ulong)uVar1 >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

virtual ImageSpec spec_dimensions (uint32_t /*subimage*/, uint32_t /*miplevel=0*/) {
        return spec();
    }